

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::transfernodes(tetgenmesh *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  tetgenio *ptVar4;
  double *pdVar5;
  tetgenbehavior *ptVar6;
  pointparam *ppVar7;
  double *in_RAX;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  point pointloop;
  double *local_38;
  
  if (0 < this->in->numberofpoints) {
    lVar12 = 0;
    lVar11 = 0;
    iVar8 = 0;
    iVar10 = 0;
    local_38 = in_RAX;
    do {
      makepoint(this,&local_38,UNUSEDVERTEX);
      ptVar4 = this->in;
      pdVar5 = ptVar4->pointlist;
      dVar13 = pdVar5[lVar12];
      *local_38 = dVar13;
      dVar14 = pdVar5[lVar12 + 1];
      local_38[1] = dVar14;
      dVar15 = pdVar5[lVar12 + 2];
      local_38[2] = dVar15;
      iVar1 = ptVar4->numberofpointattributes;
      if (0 < (long)iVar1) {
        pdVar5 = ptVar4->pointattributelist;
        lVar9 = 0;
        do {
          local_38[lVar9 + 3] = pdVar5[iVar10 + lVar9];
          lVar9 = lVar9 + 1;
        } while (iVar1 != lVar9);
        iVar10 = iVar10 + (int)lVar9;
      }
      iVar2 = ptVar4->numberofpointmtrs;
      if (0 < (long)iVar2) {
        iVar3 = this->pointmtrindex;
        pdVar5 = ptVar4->pointmtrlist;
        lVar9 = 0;
        do {
          local_38[iVar3 + lVar9] = pdVar5[iVar8 + lVar9];
          lVar9 = lVar9 + 1;
        } while (iVar2 != lVar9);
        iVar8 = iVar8 + (int)lVar9;
      }
      ptVar6 = this->b;
      if (ptVar6->weighted != 0) {
        if (iVar1 < 1) {
          dVar16 = ABS(dVar14);
          if (ABS(dVar14) <= ABS(dVar13)) {
            dVar16 = ABS(dVar13);
          }
          if (dVar16 < ABS(dVar15)) {
            dVar16 = ABS(dVar15);
          }
        }
        else {
          dVar16 = local_38[3];
        }
        if (ptVar6->weighted_param == 0) {
          dVar16 = (dVar15 * dVar15 + dVar13 * dVar13 + dVar14 * dVar14) - dVar16;
        }
        local_38[3] = dVar16;
      }
      if (lVar11 == 0) {
        this->xmax = dVar13;
        this->xmin = dVar13;
        this->ymax = dVar14;
        this->ymin = dVar14;
        this->zmax = dVar15;
        this->zmin = dVar15;
      }
      else {
        dVar16 = dVar13;
        if (this->xmin <= dVar13) {
          dVar16 = this->xmin;
        }
        this->xmin = dVar16;
        if (dVar13 <= this->xmax) {
          dVar13 = this->xmax;
        }
        this->xmax = dVar13;
        dVar13 = dVar14;
        if (this->ymin <= dVar14) {
          dVar13 = this->ymin;
        }
        this->ymin = dVar13;
        if (dVar14 <= this->ymax) {
          dVar14 = this->ymax;
        }
        this->ymax = dVar14;
        dVar13 = dVar15;
        if (this->zmin <= dVar15) {
          dVar13 = this->zmin;
        }
        this->zmin = dVar13;
        if (dVar15 <= this->zmax) {
          dVar15 = this->zmax;
        }
        this->zmax = dVar15;
      }
      if (ptVar6->psc != 0) {
        ppVar7 = ptVar4->pointparamlist;
        iVar1 = this->pointparamindex;
        local_38[iVar1] = ppVar7[lVar11].uv[0];
        local_38[(long)iVar1 + 1] = ppVar7[lVar11].uv[1];
        *(int *)((long)local_38 + (long)this->pointmarkindex * 4 + 8) = ppVar7[lVar11].tag;
        if ((ulong)(uint)ppVar7[lVar11].type < 4) {
          *(uint *)((long)local_38 + (long)this->pointmarkindex * 4 + 4) =
               (uint)*(byte *)((long)local_38 + (long)this->pointmarkindex * 4 + 4) |
               *(uint *)(&DAT_001723d0 + (ulong)(uint)ppVar7[lVar11].type * 4);
        }
      }
      lVar12 = lVar12 + 3;
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->in->numberofpoints);
  }
  dVar14 = this->xmax - this->xmin;
  dVar15 = this->ymax - this->ymin;
  dVar13 = this->zmax - this->zmin;
  dVar13 = dVar13 * dVar13 + dVar14 * dVar14 + dVar15 * dVar15;
  if (dVar13 < 0.0) {
    dVar13 = sqrt(dVar13);
  }
  else {
    dVar13 = SQRT(dVar13);
  }
  this->longest = dVar13;
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    puts("Error:  The point set is trivial.");
    puts("An input error was detected. Program stopped.");
    exit(10);
  }
  this->minedgelength = dVar13 * this->b->epsilon;
  return;
}

Assistant:

void tetgenmesh::transfernodes()
{
  point pointloop;
  REAL x, y, z, w;
  int coordindex;
  int attribindex;
  int mtrindex;
  int i, j;

  // Read the points.
  coordindex = 0;
  attribindex = 0;
  mtrindex = 0;
  for (i = 0; i < in->numberofpoints; i++) {
    makepoint(&pointloop, UNUSEDVERTEX);
    // Read the point coordinates.
    x = pointloop[0] = in->pointlist[coordindex++];
    y = pointloop[1] = in->pointlist[coordindex++];
    z = pointloop[2] = in->pointlist[coordindex++];
    // Read the point attributes. (Including point weights.)
    for (j = 0; j < in->numberofpointattributes; j++) {
      pointloop[3 + j] = in->pointattributelist[attribindex++];
    }
    // Read the point metric tensor.
    for (j = 0; j < in->numberofpointmtrs; j++) {
      pointloop[pointmtrindex + j] = in->pointmtrlist[mtrindex++];
    }
    if (b->weighted) { // -w option
      if (in->numberofpointattributes > 0) {
        // The first point attribute is its weight.
        //w = in->pointattributelist[in->numberofpointattributes * i];
        w = pointloop[3];
      } else {
        // No given weight available. Default choose the maximum
        //   absolute value among its coordinates.        
        w = fabs(x);
        if (w < fabs(y)) w = fabs(y);
        if (w < fabs(z)) w = fabs(z);
      }
      if (b->weighted_param == 0) {
        pointloop[3] = x * x + y * y + z * z - w; // Weighted DT.
      } else { // -w1 option
        pointloop[3] = w;  // Regular tetrahedralization.
      }
    }
    // Determine the smallest and largest x, y and z coordinates.
    if (i == 0) {
      xmin = xmax = x;
      ymin = ymax = y;
      zmin = zmax = z;
    } else {
      xmin = (x < xmin) ? x : xmin;
      xmax = (x > xmax) ? x : xmax;
      ymin = (y < ymin) ? y : ymin;
      ymax = (y > ymax) ? y : ymax;
      zmin = (z < zmin) ? z : zmin;
      zmax = (z > zmax) ? z : zmax;
    }
    if (b->psc) {
      // Read the geometry parameters.
      setpointgeomuv(pointloop, 0, in->pointparamlist[i].uv[0]);
      setpointgeomuv(pointloop, 1, in->pointparamlist[i].uv[1]);
      setpointgeomtag(pointloop, in->pointparamlist[i].tag);
      if (in->pointparamlist[i].type == 0) {
        setpointtype(pointloop, RIDGEVERTEX);
      } else if (in->pointparamlist[i].type == 1) {
        setpointtype(pointloop, FREESEGVERTEX);
      } else if (in->pointparamlist[i].type == 2) {
        setpointtype(pointloop, FREEFACETVERTEX);
      } else if (in->pointparamlist[i].type == 3) {
        setpointtype(pointloop, FREEVOLVERTEX);
      }
    }
  }

  // 'longest' is the largest possible edge length formed by input vertices.
  x = xmax - xmin;
  y = ymax - ymin;
  z = zmax - zmin;
  longest = sqrt(x * x + y * y + z * z);
  if (longest == 0.0) {
    printf("Error:  The point set is trivial.\n");
    terminatetetgen(this, 10);
  }
  // Two identical points are distinguished by 'minedgelength'.
  minedgelength = longest * b->epsilon;
}